

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void mp3d_synth_granule(float *qmf_state,float *grbuf,int nbands,int nch,mp3d_sample_t *pcm,
                       float *lins)

{
  int in_ECX;
  int in_EDX;
  void *in_RDI;
  void *in_R9;
  int i;
  float *in_stack_00000220;
  int in_stack_0000022c;
  mp3d_sample_t *in_stack_00000230;
  float *in_stack_00000238;
  int in_stack_00000314;
  float *in_stack_00000318;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    mp3d_DCT_II(in_stack_00000318,in_stack_00000314);
  }
  memcpy(in_R9,in_RDI,0xf00);
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 2) {
    mp3d_synth(in_stack_00000238,in_stack_00000230,in_stack_0000022c,in_stack_00000220);
  }
  if (in_ECX == 1) {
    for (local_2c = 0; local_2c < 0x3c0; local_2c = local_2c + 2) {
      *(undefined4 *)((long)in_RDI + (long)local_2c * 4) =
           *(undefined4 *)((long)in_R9 + (long)(in_EDX * 0x40 + local_2c) * 4);
    }
  }
  else {
    memcpy(in_RDI,(void *)((long)in_R9 + (long)(in_EDX << 6) * 4),0xf00);
  }
  return;
}

Assistant:

static void mp3d_synth_granule(float *qmf_state, float *grbuf, int nbands, int nch, mp3d_sample_t *pcm, float *lins)
{
    int i;
    for (i = 0; i < nch; i++)
    {
        mp3d_DCT_II(grbuf + 576*i, nbands);
    }

    memcpy(lins, qmf_state, sizeof(float)*15*64);

    for (i = 0; i < nbands; i += 2)
    {
        mp3d_synth(grbuf + i, pcm + 32*nch*i, nch, lins + i*64);
    }
#ifndef MINIMP3_NONSTANDARD_BUT_LOGICAL
    if (nch == 1)
    {
        for (i = 0; i < 15*64; i += 2)
        {
            qmf_state[i] = lins[nbands*64 + i];
        }
    } else
#endif /* MINIMP3_NONSTANDARD_BUT_LOGICAL */
    {
        memcpy(qmf_state, lins + nbands*64, sizeof(float)*15*64);
    }
}